

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
kj::ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::truncate
          (ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this,char *__file,__off_t __length
          )

{
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar1;
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar2;
  char *pcVar3;
  Maybe<kj::Own<capnp::ClientHook>_> *target;
  size_t size_local;
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this_local;
  
  pcVar3 = (char *)size(this);
  if (__file <= pcVar3) {
    pMVar1 = this->ptr;
    while (pMVar1 + (long)__file < this->pos) {
      pRVar2 = this->pos;
      this->pos = pRVar2 + -1;
      dtor<kj::Maybe<kj::Own<capnp::ClientHook>>>(pRVar2 + -1);
    }
    return (int)this->pos;
  }
  _::inlineRequireFailure
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/../kj/array.h"
             ,0x1a3,"size <= this->size()","\"can\'t use truncate() to expand\"",
             "can\'t use truncate() to expand");
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }